

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.cpp
# Opt level: O3

void __thiscall CTilesetMapper::Load(CTilesetMapper *this,json_value *rElement)

{
  json_type jVar1;
  json_object_entry *pjVar2;
  char *pcVar3;
  int iVar4;
  _json_value *p_Var5;
  uint uVar6;
  _json_value *p_Var7;
  _json_value *p_Var8;
  _json_value *p_Var9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  bool bVar15;
  bool bVar16;
  CRuleCondition local_104;
  CRule local_f8;
  CRuleSet local_d0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (rElement->u).string.length;
  if (uVar6 != 0) {
    uVar11 = 0;
    do {
      p_Var7 = &json_value_none;
      iVar4 = (int)uVar11;
      if ((-1 < iVar4) && (p_Var7 = &json_value_none, rElement->type == json_array)) {
        p_Var7 = *(_json_value **)((rElement->u).string.ptr + uVar11 * 8);
      }
      if ((p_Var7->u).boolean == 1) {
        local_d0.m_aRules.list = (CRule *)0x0;
        local_d0.m_aRules.list_size = 1;
        local_d0.m_aRules.list = allocator_default<CTilesetMapper::CRule>::alloc_array(1);
        local_d0.m_aRules.num_elements = 0;
        p_Var7 = &json_value_none;
        if (((-1 < iVar4) && (p_Var7 = &json_value_none, rElement->type == json_array)) &&
           (p_Var7 = &json_value_none, uVar11 < (rElement->u).string.length)) {
          p_Var7 = *(_json_value **)((rElement->u).string.ptr + uVar11 * 8);
        }
        str_copy(local_d0.m_aName,((p_Var7->u).object.values)->name,0x80);
        p_Var7 = &json_value_none;
        if (((-1 < iVar4) && (p_Var7 = &json_value_none, rElement->type == json_array)) &&
           (p_Var7 = &json_value_none, uVar11 < (rElement->u).string.length)) {
          p_Var7 = *(_json_value **)((rElement->u).string.ptr + uVar11 * 8);
        }
        p_Var7 = ((p_Var7->u).object.values)->value;
        jVar1 = p_Var7->type;
        p_Var5 = &json_value_none;
        if (jVar1 == json_object) {
          uVar14 = (ulong)(p_Var7->u).string.length;
          p_Var5 = &json_value_none;
          if (uVar14 != 0) {
            pjVar2 = (p_Var7->u).object.values;
            lVar13 = 0;
            do {
              iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar13),"basetile");
              if (iVar4 == 0) {
                p_Var5 = *(_json_value **)((long)&pjVar2->value + lVar13);
                goto LAB_0018e376;
              }
              lVar13 = lVar13 + 0x18;
            } while (uVar14 * 0x18 != lVar13);
            p_Var5 = &json_value_none;
          }
        }
LAB_0018e376:
        local_d0.m_BaseTile = 1;
        if (p_Var5->type == json_integer) {
          local_d0.m_BaseTile = (p_Var5->u).boolean;
          if (0xfe < local_d0.m_BaseTile) {
            local_d0.m_BaseTile = 0xff;
          }
          if (local_d0.m_BaseTile < 1) {
            local_d0.m_BaseTile = 0;
          }
        }
        p_Var5 = &json_value_none;
        if (jVar1 == json_object) {
          uVar14 = (ulong)(p_Var7->u).string.length;
          p_Var5 = &json_value_none;
          if (uVar14 != 0) {
            pjVar2 = (p_Var7->u).object.values;
            lVar13 = 0;
            do {
              iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar13),"rules");
              if (iVar4 == 0) {
                p_Var5 = *(_json_value **)((long)&pjVar2->value + lVar13);
                goto LAB_0018e3e8;
              }
              lVar13 = lVar13 + 0x18;
            } while (uVar14 * 0x18 != lVar13);
            p_Var5 = &json_value_none;
          }
        }
LAB_0018e3e8:
        if ((p_Var5->u).boolean != 0) {
          uVar14 = 0;
          do {
            local_f8.m_aConditions.list_size = 1;
            local_f8.m_aConditions.list = (CRuleCondition *)operator_new__(0xc);
            local_f8.m_aConditions.num_elements = 0;
            jVar1 = p_Var5->type;
            bVar16 = jVar1 == json_array;
            bVar15 = uVar14 < (p_Var5->u).string.length;
            p_Var7 = &json_value_none;
            if (bVar15 && bVar16) {
              p_Var7 = *(_json_value **)((p_Var5->u).string.ptr + uVar14 * 8);
            }
            p_Var8 = &json_value_none;
            if (p_Var7->type == json_object) {
              uVar12 = (ulong)(p_Var7->u).string.length;
              p_Var8 = &json_value_none;
              if (uVar12 != 0) {
                pjVar2 = (p_Var7->u).object.values;
                lVar13 = 0;
                do {
                  iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar13),"index");
                  if (iVar4 == 0) {
                    p_Var8 = *(_json_value **)((long)&pjVar2->value + lVar13);
                    goto LAB_0018e4a4;
                  }
                  lVar13 = lVar13 + 0x18;
                } while (uVar12 * 0x18 != lVar13);
                p_Var8 = &json_value_none;
              }
            }
LAB_0018e4a4:
            local_f8.m_Index = 1;
            if (p_Var8->type == json_integer) {
              local_f8.m_Index = (p_Var8->u).boolean;
              if (0xfe < local_f8.m_Index) {
                local_f8.m_Index = 0xff;
              }
              if (local_f8.m_Index < 1) {
                local_f8.m_Index = 0;
              }
            }
            p_Var7 = &json_value_none;
            if (bVar15 && bVar16) {
              p_Var7 = *(_json_value **)((p_Var5->u).string.ptr + uVar14 * 8);
            }
            p_Var8 = &json_value_none;
            if (p_Var7->type == json_object) {
              uVar12 = (ulong)(p_Var7->u).string.length;
              p_Var8 = &json_value_none;
              if (uVar12 != 0) {
                pjVar2 = (p_Var7->u).object.values;
                lVar13 = 0;
                do {
                  iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar13),"random");
                  if (iVar4 == 0) {
                    p_Var8 = *(_json_value **)((long)&pjVar2->value + lVar13);
                    goto LAB_0018e532;
                  }
                  lVar13 = lVar13 + 0x18;
                } while (uVar12 * 0x18 != lVar13);
                p_Var8 = &json_value_none;
              }
            }
LAB_0018e532:
            local_f8.m_Random = 0;
            if (p_Var8->type == json_integer) {
              local_f8.m_Random = (p_Var8->u).boolean;
              if (0x1869e < local_f8.m_Random) {
                local_f8.m_Random = 99999;
              }
              if (local_f8.m_Random < 1) {
                local_f8.m_Random = 0;
              }
            }
            p_Var7 = &json_value_none;
            if (bVar15 && bVar16) {
              p_Var7 = *(_json_value **)((p_Var5->u).string.ptr + uVar14 * 8);
            }
            p_Var8 = &json_value_none;
            if (p_Var7->type == json_object) {
              uVar12 = (ulong)(p_Var7->u).string.length;
              p_Var8 = &json_value_none;
              if (uVar12 != 0) {
                pjVar2 = (p_Var7->u).object.values;
                lVar13 = 0;
                do {
                  iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar13),"rotate");
                  if (iVar4 == 0) {
                    p_Var8 = *(_json_value **)((long)&pjVar2->value + lVar13);
                    goto LAB_0018e5bd;
                  }
                  lVar13 = lVar13 + 0x18;
                } while (uVar12 * 0x18 != lVar13);
                p_Var8 = &json_value_none;
              }
            }
LAB_0018e5bd:
            local_f8.m_Rotation = 0;
            if ((p_Var8->type == json_integer) &&
               (((lVar13 = (p_Var8->u).integer, lVar13 == 0x5a || (lVar13 == 0x10e)) ||
                (lVar13 == 0xb4)))) {
              local_f8.m_Rotation = (int)lVar13;
            }
            bVar16 = jVar1 == json_array;
            bVar15 = uVar14 < (p_Var5->u).string.length;
            p_Var7 = &json_value_none;
            if (bVar15 && bVar16) {
              p_Var7 = *(_json_value **)((p_Var5->u).string.ptr + uVar14 * 8);
            }
            p_Var8 = &json_value_none;
            if (p_Var7->type == json_object) {
              uVar12 = (ulong)(p_Var7->u).string.length;
              p_Var8 = &json_value_none;
              if (uVar12 != 0) {
                pjVar2 = (p_Var7->u).object.values;
                lVar13 = 0;
                do {
                  iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar13),"hflip");
                  if (iVar4 == 0) {
                    p_Var8 = *(_json_value **)((long)&pjVar2->value + lVar13);
                    goto LAB_0018e65c;
                  }
                  lVar13 = lVar13 + 0x18;
                } while (uVar12 * 0x18 != lVar13);
                p_Var8 = &json_value_none;
              }
            }
LAB_0018e65c:
            local_f8.m_HFlip = 0;
            if (p_Var8->type == json_integer) {
              local_f8.m_HFlip = (int)(0 < (p_Var8->u).boolean);
            }
            p_Var7 = &json_value_none;
            if (bVar15 && bVar16) {
              p_Var7 = *(_json_value **)((p_Var5->u).string.ptr + uVar14 * 8);
            }
            p_Var8 = &json_value_none;
            if (p_Var7->type == json_object) {
              uVar12 = (ulong)(p_Var7->u).string.length;
              p_Var8 = &json_value_none;
              if (uVar12 != 0) {
                pjVar2 = (p_Var7->u).object.values;
                lVar13 = 0;
                do {
                  iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar13),"vflip");
                  if (iVar4 == 0) {
                    p_Var8 = *(_json_value **)((long)&pjVar2->value + lVar13);
                    goto LAB_0018e6d4;
                  }
                  lVar13 = lVar13 + 0x18;
                } while (uVar12 * 0x18 != lVar13);
                p_Var8 = &json_value_none;
              }
            }
LAB_0018e6d4:
            local_f8.m_VFlip = 0;
            if (p_Var8->type == json_integer) {
              local_f8.m_VFlip = (int)(0 < (p_Var8->u).boolean);
            }
            p_Var7 = &json_value_none;
            if (bVar15 && bVar16) {
              p_Var7 = *(_json_value **)((p_Var5->u).string.ptr + uVar14 * 8);
            }
            p_Var8 = &json_value_none;
            if (p_Var7->type == json_object) {
              uVar12 = (ulong)(p_Var7->u).string.length;
              p_Var8 = &json_value_none;
              if (uVar12 != 0) {
                pjVar2 = (p_Var7->u).object.values;
                lVar13 = 0;
                do {
                  iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar13),"condition");
                  if (iVar4 == 0) {
                    p_Var8 = *(_json_value **)((long)&pjVar2->value + lVar13);
                    goto LAB_0018e747;
                  }
                  lVar13 = lVar13 + 0x18;
                } while (uVar12 * 0x18 != lVar13);
                p_Var8 = &json_value_none;
              }
            }
LAB_0018e747:
            if ((p_Var8->type == json_array) && ((p_Var8->u).boolean != 0)) {
              uVar12 = 0;
              do {
                bVar15 = p_Var8->type == json_array;
                bVar16 = -1 < (int)uVar12;
                p_Var7 = &json_value_none;
                if (bVar16 && bVar15) {
                  p_Var7 = *(_json_value **)((p_Var8->u).string.ptr + uVar12 * 8);
                }
                p_Var9 = &json_value_none;
                if (p_Var7->type == json_object) {
                  uVar10 = (ulong)(p_Var7->u).string.length;
                  p_Var9 = &json_value_none;
                  if (uVar10 != 0) {
                    pjVar2 = (p_Var7->u).object.values;
                    lVar13 = 0;
                    do {
                      pcVar3 = *(char **)((long)&pjVar2->name + lVar13);
                      if ((*pcVar3 == 'x') && (pcVar3[1] == '\0')) {
                        p_Var9 = *(_json_value **)((long)&pjVar2->value + lVar13);
                        goto LAB_0018e7c0;
                      }
                      lVar13 = lVar13 + 0x18;
                    } while (uVar10 * 0x18 != lVar13);
                    p_Var9 = &json_value_none;
                  }
                }
LAB_0018e7c0:
                local_104.m_X = (p_Var9->u).boolean;
                p_Var7 = &json_value_none;
                if (bVar16 && bVar15) {
                  p_Var7 = *(_json_value **)((p_Var8->u).string.ptr + uVar12 * 8);
                }
                p_Var9 = &json_value_none;
                if (p_Var7->type == json_object) {
                  uVar10 = (ulong)(p_Var7->u).string.length;
                  p_Var9 = &json_value_none;
                  if (uVar10 != 0) {
                    pjVar2 = (p_Var7->u).object.values;
                    lVar13 = 0;
                    do {
                      pcVar3 = *(char **)((long)&pjVar2->name + lVar13);
                      if ((*pcVar3 == 'y') && (pcVar3[1] == '\0')) {
                        p_Var9 = *(_json_value **)((long)&pjVar2->value + lVar13);
                        goto LAB_0018e81a;
                      }
                      lVar13 = lVar13 + 0x18;
                    } while (uVar10 * 0x18 != lVar13);
                    p_Var9 = &json_value_none;
                  }
                }
LAB_0018e81a:
                local_104.m_Y = (p_Var9->u).boolean;
                p_Var7 = &json_value_none;
                if (bVar16 && bVar15) {
                  p_Var7 = *(_json_value **)((p_Var8->u).string.ptr + uVar12 * 8);
                }
                p_Var9 = &json_value_none;
                if (p_Var7->type == json_object) {
                  uVar10 = (ulong)(p_Var7->u).string.length;
                  p_Var9 = &json_value_none;
                  if (uVar10 != 0) {
                    pjVar2 = (p_Var7->u).object.values;
                    lVar13 = 0;
                    do {
                      iVar4 = strcmp(*(char **)((long)&pjVar2->name + lVar13),"value");
                      if (iVar4 == 0) {
                        p_Var9 = *(_json_value **)((long)&pjVar2->value + lVar13);
                        goto LAB_0018e87e;
                      }
                      lVar13 = lVar13 + 0x18;
                    } while (uVar10 * 0x18 != lVar13);
                    p_Var9 = &json_value_none;
                  }
                }
LAB_0018e87e:
                if (p_Var9->type == json_integer) {
                  uVar6 = (p_Var9->u).boolean;
                  if (0xfe < (int)uVar6) {
                    uVar6 = 0xff;
                  }
                  if ((int)uVar6 < -1) {
                    uVar6 = 0xfffffffe;
                  }
                }
                else {
                  uVar6 = 0xfffffffe;
                  if (p_Var9->type == json_string) {
                    iVar4 = str_comp((p_Var9->u).string.ptr,"full");
                    uVar6 = iVar4 == 0 | 0xfffffffe;
                  }
                }
                local_104.m_Value = uVar6;
                array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
                ::add(&local_f8.m_aConditions,&local_104);
                uVar12 = uVar12 + 1;
              } while (uVar12 < (p_Var8->u).string.length);
            }
            array<CTilesetMapper::CRule,_allocator_default<CTilesetMapper::CRule>_>::add
                      (&local_d0.m_aRules,&local_f8);
            if (local_f8.m_aConditions.list != (CRuleCondition *)0x0) {
              operator_delete__(local_f8.m_aConditions.list);
            }
          } while ((uVar14 < 0xff) && (uVar14 = uVar14 + 1, uVar14 < (p_Var5->u).string.length));
        }
        array<CTilesetMapper::CRuleSet,_allocator_default<CTilesetMapper::CRuleSet>_>::add
                  (&this->m_aRuleSets,&local_d0);
        allocator_default<CTilesetMapper::CRule>::free_array(local_d0.m_aRules.list);
        uVar6 = (rElement->u).string.length;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTilesetMapper::Load(const json_value &rElement)
{
	for(unsigned i = 0; i < rElement.u.array.length; ++i)
	{
		if(rElement[i].u.object.length != 1)
			continue;

		// new rule set
		CRuleSet NewRuleSet;
		const char* pConfName = rElement[i].u.object.values[0].name;
		str_copy(NewRuleSet.m_aName, pConfName, sizeof(NewRuleSet.m_aName));
		const json_value &rStart = *(rElement[i].u.object.values[0].value);

		// get basetile
		const json_value &rBasetile = rStart["basetile"];
		if(rBasetile.type == json_integer)
			NewRuleSet.m_BaseTile = clamp((int)rBasetile.u.integer, 0, 255);
		else
			NewRuleSet.m_BaseTile = 1;

		// get rules
		const json_value &rRuleNode = rStart["rules"];
		for(unsigned j = 0; j < rRuleNode.u.array.length && j < MAX_RULES; j++)
		{
			// create a new rule
			CRule NewRule;

			// index
			const json_value &rIndex = rRuleNode[j]["index"];
			if(rIndex.type == json_integer)
				NewRule.m_Index = clamp((int)rIndex.u.integer, 0, 255);
			else
				NewRule.m_Index = 1;

			// random
			const json_value &rRandom = rRuleNode[j]["random"];
			if(rRandom.type == json_integer)
				NewRule.m_Random = clamp((int)rRandom.u.integer, 0, 99999);
			else
				NewRule.m_Random = 0;

			// rotate
			const json_value &rRotate = rRuleNode[j]["rotate"];
			if(rRotate.type == json_integer && (rRotate.u.integer == 90 || rRotate.u.integer == 180 || rRotate.u.integer == 270))
				NewRule.m_Rotation = rRotate.u.integer;
			else
				NewRule.m_Rotation = 0;

			// hflip
			const json_value &rHFlip = rRuleNode[j]["hflip"];
			if(rHFlip.type == json_integer)
				NewRule.m_HFlip = clamp((int)rHFlip.u.integer, 0, 1);
			else
				NewRule.m_HFlip = 0;

			// vflip
			const json_value &rVFlip = rRuleNode[j]["vflip"];
			if(rVFlip.type == json_integer)
				NewRule.m_VFlip = clamp((int)rVFlip.u.integer, 0, 1);
			else
				NewRule.m_VFlip = 0;

			// get rule's content
			const json_value &rCondition = rRuleNode[j]["condition"];
			if(rCondition.type == json_array)
			{
				for(unsigned k = 0; k < rCondition.u.array.length; k++)
				{
					CRuleCondition Condition;

					Condition.m_X = rCondition[k]["x"].u.integer;
					Condition.m_Y = rCondition[k]["y"].u.integer;
					const json_value &rValue = rCondition[k]["value"];
					if(rValue.type == json_string)
					{
						// the value is not an index, check if it's full or empty
						if(str_comp((const char *)rValue, "full") == 0)
							Condition.m_Value = CRuleCondition::FULL;
						else
							Condition.m_Value = CRuleCondition::EMPTY;
					}
					else if(rValue.type == json_integer)
						Condition.m_Value = clamp((int)rValue.u.integer, (int)CRuleCondition::EMPTY, 255);
					else
						Condition.m_Value = CRuleCondition::EMPTY;

					NewRule.m_aConditions.add(Condition);
				}
			}

			NewRuleSet.m_aRules.add(NewRule);
		}

		m_aRuleSets.add(NewRuleSet);
	}
}